

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Discoverer.cpp
# Opt level: O1

void __thiscall new_words_discover::Discoverer::print(Discoverer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppVar3;
  char cVar4;
  ulong uVar5;
  long lVar6;
  wostream *pwVar7;
  ostream *poVar8;
  long *plVar9;
  undefined8 uVar10;
  size_type *psVar11;
  __normal_iterator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>_>
  __i;
  long lVar12;
  pointer ppVar13;
  pointer ppVar14;
  string out_file;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  sorted;
  wofstream output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230;
  wfilebuf local_228 [8];
  long local_220 [29];
  ios_base local_138 [264];
  
  std::
  vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>
  ::
  vector<std::__detail::_Node_iterator<std::pair<std::__cxx11::wstring_const,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,false,true>,void>
            ((vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>
              *)&local_268,
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_false,_true>
              )(this->words_)._M_h._M_before_begin._M_nxt,
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_false,_true>
              )0x0,(allocator_type *)&local_230);
  ppVar3 = local_268.
           super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar14 = local_268.
            super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_268.
      super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_268.
      super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar12 = (long)local_268.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_268.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (lVar12 >> 5) * -0x3333333333333333;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>*,std::vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<new_words_discover::Discoverer::print()::__0>>
              (local_268.
               super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_268.
               super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar12 < 0xa01) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>*,std::vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<new_words_discover::Discoverer::print()::__0>>
                (ppVar14,ppVar3);
    }
    else {
      ppVar13 = ppVar14 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>*,std::vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<new_words_discover::Discoverer::print()::__0>>
                (ppVar14,ppVar13);
      for (; ppVar13 != ppVar3; ppVar13 = ppVar13 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>*,std::vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>>,__gnu_cxx::__ops::_Val_comp_iter<new_words_discover::Discoverer::print()::__0>>
                  (ppVar13);
      }
    }
  }
  lVar6 = std::__cxx11::string::rfind((char)&this->filename_,0x2e);
  paVar1 = &local_288.field_2;
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  local_288._M_dataplus._M_p = (pointer)paVar1;
  if (lVar6 == -1) {
    pcVar2 = (this->filename_)._M_dataplus._M_p;
    local_230 = local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,pcVar2 + (this->filename_)._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_230,(ulong)&this->filename_);
  }
  std::__cxx11::string::operator=((string *)&local_288,(string *)&local_230);
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_288);
  std::wofstream::wofstream(&local_230,(string *)&local_288,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::operator+(&local_250,"Failed to open ",&local_288);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_250);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2a8.field_2._M_allocated_capacity = *psVar11;
      local_2a8.field_2._8_8_ = plVar9[3];
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = *psVar11;
      local_2a8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2a8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_2a8._M_dataplus._M_p,local_2a8._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == &local_250.field_2) goto LAB_001344d8;
  }
  else {
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              ((wostream *)&local_230,L"Total words: ",0xd);
    pwVar7 = std::wostream::_M_insert<unsigned_long>((ulong)&local_230);
    plVar9 = *(long **)(pwVar7 + *(long *)(*(long *)pwVar7 + -0x18) + 0xf0);
    if (plVar9 == (long *)0x0) {
LAB_00134545:
      uVar10 = std::__throw_bad_cast();
      std::wofstream::~wofstream(&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
      ::~vector(&local_268);
      _Unwind_Resume(uVar10);
    }
    (**(code **)(*plVar9 + 0x50))(plVar9,10);
    std::wostream::put((wchar_t)pwVar7);
    std::wostream::flush();
    if (local_268.
        super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_268.
        super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar14 = local_268.
                super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           ((wostream *)&local_230,(ppVar14->first)._M_dataplus._M_p,
                            (ppVar14->first)._M_string_length);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar7,L" ",1);
        pwVar7 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
        plVar9 = *(long **)(pwVar7 + *(long *)(*(long *)pwVar7 + -0x18) + 0xf0);
        if (plVar9 == (long *)0x0) {
          std::__throw_bad_cast();
          goto LAB_00134545;
        }
        (**(code **)(*plVar9 + 0x50))(plVar9,10);
        std::wostream::put((wchar_t)pwVar7);
        std::wostream::flush();
        ppVar14 = ppVar14 + 1;
      } while (ppVar14 !=
               local_268.
               super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::operator+(&local_2a8,"The results are stored in ",&local_288);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_2a8._M_dataplus._M_p,local_2a8._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    local_250.field_2._M_allocated_capacity = local_2a8.field_2._M_allocated_capacity;
    local_250._M_dataplus._M_p = local_2a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p == &local_2a8.field_2) goto LAB_001344d8;
  }
  operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
LAB_001344d8:
  local_230 = _VTT;
  *(undefined8 *)(local_228 + _VTT[-3] + -8) = _append;
  std::wfilebuf::~wfilebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  ::~vector(&local_268);
  return;
}

Assistant:

void Discoverer::print()
{
    std::vector<std::pair<std::wstring, word_t>> sorted(words_.begin(), words_.end());
    std::sort(sorted.begin(), sorted.end(), [](auto &x, auto &y) {
        return std::get<frequency_t>(x.second) < std::get<frequency_t>(y.second);
    });

    // Generating output filename by input filename, remove suffix if any.
    auto dot = filename_.find_last_of('.');
    std::string out_file;
    out_file = (dot != std::string::npos ? filename_.substr(0, dot) : filename_);
    out_file += "_out.txt";
    std::wofstream output(out_file);
    if (!output.is_open()) {
        std::cerr << "Failed to open " + out_file + "!" << std::endl;
        return;
    }
    output << L"Total words: " << sorted.size() << std::endl;
    for (const auto &s : sorted) {
        output << s.first << L" " << std::get<frequency_t>(s.second) << std::endl;
    }
    std::cout << "The results are stored in " + out_file << std::endl;
}